

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<QObject_const*,QList<QCss::StyleRule>>::emplace<QList<QCss::StyleRule>const&>
          (QHash<const_QObject_*,_QList<QCss::StyleRule>_> *this,QObject **key,
          QList<QCss::StyleRule> *args)

{
  long lVar1;
  bool bVar2;
  QObject **in_RSI;
  QHash<const_QObject_*,_QList<QCss::StyleRule>_> *in_RDI;
  long in_FS_OFFSET;
  QHash<const_QObject_*,_QList<QCss::StyleRule>_> copy;
  QList<QCss::StyleRule> *in_stack_ffffffffffffff88;
  QList<QCss::StyleRule> *in_stack_ffffffffffffff90;
  QList<QCss::StyleRule> *in_stack_ffffffffffffff98;
  QObject **in_stack_ffffffffffffffa0;
  piter local_38;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QHash<const_QObject_*,_QList<QCss::StyleRule>_>::isDetached
                    ((QHash<const_QObject_*,_QList<QCss::StyleRule>_> *)in_stack_ffffffffffffff90);
  if (bVar2) {
    bVar2 = QHashPrivate::Data<QHashPrivate::Node<const_QObject_*,_QList<QCss::StyleRule>_>_>::
            shouldGrow(in_RDI->d);
    if (bVar2) {
      QList<QCss::StyleRule>::QList(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      local_38 = (piter)emplace_helper<QList<QCss::StyleRule>>
                                  (in_RDI,in_RSI,in_stack_ffffffffffffff98);
      QList<QCss::StyleRule>::~QList((QList<QCss::StyleRule> *)0x46b07e);
    }
    else {
      local_38 = (piter)emplace_helper<QList<QCss::StyleRule>const&>
                                  (in_RDI,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    }
  }
  else {
    QHash<const_QObject_*,_QList<QCss::StyleRule>_>::QHash
              ((QHash<const_QObject_*,_QList<QCss::StyleRule>_> *)in_stack_ffffffffffffff90,
               (QHash<const_QObject_*,_QList<QCss::StyleRule>_> *)in_stack_ffffffffffffff88);
    QHash<const_QObject_*,_QList<QCss::StyleRule>_>::detach
              ((QHash<const_QObject_*,_QList<QCss::StyleRule>_> *)in_stack_ffffffffffffff90);
    local_38 = (piter)emplace_helper<QList<QCss::StyleRule>const&>
                                (in_RDI,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    QHash<const_QObject_*,_QList<QCss::StyleRule>_>::~QHash
              ((QHash<const_QObject_*,_QList<QCss::StyleRule>_> *)in_stack_ffffffffffffff90);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (iterator)local_38;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }